

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentTypeImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMDocumentTypeImpl::DOMDocumentTypeImpl
          (DOMDocumentTypeImpl *this,DOMDocument *ownerDoc,XMLCh *qualifiedName,XMLCh *pubId,
          XMLCh *sysId,bool heap)

{
  long *plVar1;
  DOMDocument *doc;
  bool bVar2;
  uint uVar3;
  int iVar4;
  XMLSize_t XVar5;
  XMLCh *pXVar6;
  DOMException *pDVar7;
  undefined4 extraout_var;
  long **pplVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNamedNodeMapImpl *pDVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  DOMNode *pDVar10;
  ulong maxChars;
  XMLCh temp [256];
  
  (this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMDocumentTypeImpl_003fd168;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_003fd348;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_003fd378;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_003fd3a8;
  pDVar10 = &ownerDoc->super_DOMNode;
  if (ownerDoc == (DOMDocument *)0x0) {
    pDVar10 = (DOMNode *)0x0;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,pDVar10);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  DOMChildNode::DOMChildNode(&this->fChild);
  *(undefined8 *)((long)&this->fSystemId + 1) = 0;
  *(undefined8 *)((long)&this->fInternalSubset + 1) = 0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fNotations = (DOMNamedNodeMapImpl *)0x0;
  this->fElements = (DOMNamedNodeMapImpl *)0x0;
  this->fName = (XMLCh *)0x0;
  this->fEntities = (DOMNamedNodeMapImpl *)0x0;
  this->fIsCreatedFromHeap = heap;
  uVar3 = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
  plVar1 = XMLPlatformUtils::fgMemoryManager;
  if ((int)uVar3 < 0) {
    pDVar7 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar4 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_04,iVar4) == 0) {
      pplVar8 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar4 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
      pplVar8 = (long **)(CONCAT44(extraout_var_06,iVar4) + 0x158);
    }
    DOMException::DOMException(pDVar7,0xe,0,(MemoryManager *)*pplVar8);
    __cxa_throw(pDVar7,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (uVar3 != 0) {
    if (uVar3 < 0xff) {
      pXVar6 = temp;
    }
    else {
      XVar5 = XMLString::stringLen(qualifiedName);
      pXVar6 = (XMLCh *)(**(code **)(*plVar1 + 0x18))(plVar1,XVar5 * 2 + 2);
    }
    maxChars = (ulong)uVar3;
    XMLString::copyNString(pXVar6,qualifiedName,maxChars);
    pXVar6[maxChars] = L'\0';
    if (ownerDoc == (DOMDocument *)0x0) {
      bVar2 = XMLChar1_0::isValidName(pXVar6);
      if ((!bVar2) || (bVar2 = XMLChar1_0::isValidName(qualifiedName + maxChars + 1), !bVar2)) {
        pDVar7 = (DOMException *)__cxa_allocate_exception(0x28);
        iVar4 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
        if (CONCAT44(extraout_var_05,iVar4) == 0) {
          pplVar8 = &XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar4 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
          pplVar8 = (long **)(CONCAT44(extraout_var_08,iVar4) + 0x158);
        }
        DOMException::DOMException(pDVar7,0xe,0,(MemoryManager *)*pplVar8);
        goto LAB_0027a4a3;
      }
    }
    else {
      bVar2 = DOMDocumentImpl::isXMLName((DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode,pXVar6);
      if ((!bVar2) ||
         (bVar2 = DOMDocumentImpl::isXMLName
                            ((DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode,
                             qualifiedName + maxChars + 1), !bVar2)) {
        pDVar7 = (DOMException *)__cxa_allocate_exception(0x28);
        iVar4 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
        if (CONCAT44(extraout_var,iVar4) == 0) {
          pplVar8 = &XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar4 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
          pplVar8 = (long **)(CONCAT44(extraout_var_07,iVar4) + 0x158);
        }
        DOMException::DOMException(pDVar7,0xe,0,(MemoryManager *)*pplVar8);
LAB_0027a4a3:
        __cxa_throw(pDVar7,&DOMException::typeinfo,DOMException::~DOMException);
      }
    }
    if (0xfe < uVar3) {
      (**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x20))
                (XMLPlatformUtils::fgMemoryManager,pXVar6);
    }
  }
  if (ownerDoc == (DOMDocument *)0x0) {
    XMLMutexLock::XMLMutexLock((XMLMutexLock *)temp,sDocumentMutex);
    doc = sDocument;
    pDVar10 = &sDocument[-1].super_DOMNode;
    iVar4 = (*sDocument[-1].super_DOMNode._vptr_DOMNode[7])(pDVar10,pubId);
    this->fPublicId = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
    iVar4 = (*pDVar10->_vptr_DOMNode[7])(pDVar10,sysId);
    this->fSystemId = (XMLCh *)CONCAT44(extraout_var_03,iVar4);
    pXVar6 = DOMDocumentImpl::getPooledString((DOMDocumentImpl *)pDVar10,qualifiedName);
    this->fName = pXVar6;
    pDVar9 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fEntities = pDVar9;
    pDVar9 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fNotations = pDVar9;
    pDVar9 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fElements = pDVar9;
    XMLMutexLock::~XMLMutexLock((XMLMutexLock *)temp);
  }
  else {
    pDVar10 = &ownerDoc[-1].super_DOMNode;
    iVar4 = (*ownerDoc[-1].super_DOMNode._vptr_DOMNode[7])(pDVar10,pubId);
    this->fPublicId = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
    iVar4 = (*pDVar10->_vptr_DOMNode[7])(pDVar10,sysId);
    this->fSystemId = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
    pXVar6 = DOMDocumentImpl::getPooledString((DOMDocumentImpl *)pDVar10,qualifiedName);
    this->fName = pXVar6;
    pDVar9 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fEntities = pDVar9;
    pDVar9 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fNotations = pDVar9;
    pDVar9 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar9,(DOMNode *)this);
    this->fElements = pDVar9;
  }
  return;
}

Assistant:

DOMDocumentTypeImpl::DOMDocumentTypeImpl(DOMDocument *ownerDoc,
                                   const XMLCh *qualifiedName,
                                   const XMLCh *pubId,
                                   const XMLCh *sysId,
                                   bool heap)
    : fNode(this, ownerDoc),
    fParent(this, ownerDoc),
    fName(0),
    fEntities(0),
    fNotations(0),
    fElements(0),
    fPublicId(0),
    fSystemId(0),
    fInternalSubset(0),
    fIntSubsetReading(false),
    fIsCreatedFromHeap(heap)
{
    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    else if (index > 0)
    {
        // we have to make sure the qualifiedName has correct prefix and localName
        // although we don't really to store them separately
        XMLCh* newName;
        XMLCh temp[256];
        if (index >= 255)
            newName = (XMLCh*) XMLPlatformUtils::fgMemoryManager->allocate
            (
                (XMLString::stringLen(qualifiedName)+1) * sizeof(XMLCh)
            );//new XMLCh[XMLString::stringLen(qualifiedName)+1];
        else
            newName = temp;

        XMLString::copyNString(newName, qualifiedName, index);
        newName[index] = chNull;

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (ownerDoc) {
            if (!((DOMDocumentImpl*)ownerDoc)->isXMLName(newName) || !((DOMDocumentImpl*)ownerDoc)->isXMLName(qualifiedName+index+1))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
        }
        else {
            // document is not there yet, so assume XML 1.0
            if (!XMLChar1_0::isValidName(newName) || !XMLChar1_0::isValidName(qualifiedName+index+1))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
        }

        if (index >= 255)
            XMLPlatformUtils::fgMemoryManager->deallocate(newName);//delete[] newName;
    }

    if (ownerDoc)
    {
        DOMDocumentImpl *docImpl = (DOMDocumentImpl *)ownerDoc;
        fPublicId = docImpl->cloneString(pubId);
        fSystemId = docImpl->cloneString(sysId);
        fName = ((DOMDocumentImpl *)ownerDoc)->getPooledString(qualifiedName);
        fEntities = new (ownerDoc) DOMNamedNodeMapImpl(this);
        fNotations= new (ownerDoc) DOMNamedNodeMapImpl(this);
        fElements = new (ownerDoc) DOMNamedNodeMapImpl(this);
    }
    else
    {
        XMLMutexLock lock(sDocumentMutex);
        DOMDocument* doc = sDocument;
        fPublicId = ((DOMDocumentImpl*) doc)->cloneString(pubId);
        fSystemId = ((DOMDocumentImpl*) doc)->cloneString(sysId);
        fName = ((DOMDocumentImpl*) doc)->getPooledString(qualifiedName);
        fEntities = new (doc) DOMNamedNodeMapImpl(this);
        fNotations= new (doc) DOMNamedNodeMapImpl(this);
        fElements = new (doc) DOMNamedNodeMapImpl(this);
    }
}